

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  secp256k1_scalar *psVar13;
  uchar *puVar14;
  uint uVar15;
  int iVar16;
  uint64_t uVar17;
  ulong uVar18;
  long lVar19;
  code *pcVar20;
  uint uVar21;
  uint uVar22;
  uint64_t uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int overflow;
  secp256k1_scalar non;
  secp256k1_ge r_1;
  uchar nonce32 [32];
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  secp256k1_scalar n;
  uchar b [32];
  uint local_254;
  uint local_250;
  int local_24c;
  secp256k1_scalar *local_248;
  uint *local_240;
  secp256k1_context *local_238;
  uint local_230;
  uint local_22c;
  secp256k1_scalar *local_228;
  uchar *local_220;
  uchar *local_218;
  secp256k1_modinv64_signed62 local_210;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  secp256k1_nonce_function local_160;
  secp256k1_scalar local_158;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  uchar local_d8 [32];
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uchar local_58 [40];
  
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  pcVar20 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    pcVar20 = noncefp;
  }
  local_248 = r;
  local_240 = (uint *)recid;
  local_238 = ctx;
  local_228 = s;
  local_220 = msg32;
  local_218 = seckey;
  secp256k1_scalar_set_b32(&local_98,seckey,(int *)local_1e8);
  puVar14 = local_220;
  local_230 = (uint)(((local_98.d[2] != 0 || local_98.d[3] != 0) ||
                     (local_98.d[1] != 0 || local_98.d[0] != 0)) && local_1e8._0_4_ == 0);
  uVar15 = local_230 ^ 1;
  local_1e8._0_4_ = uVar15;
  uVar1 = (long)(int)uVar15 - 1;
  local_98.d[1] = local_98.d[1] & uVar1;
  local_98.d[0] = (ulong)uVar15 | local_98.d[0] & uVar1;
  local_98.d[3] = uVar1 & local_98.d[3];
  local_98.d[2] = local_98.d[2] & uVar1;
  uVar15 = 0;
  secp256k1_scalar_set_b32(&local_b8,local_220,(int *)0x0);
  local_160 = pcVar20;
  iVar16 = (*pcVar20)(local_d8,puVar14,seckey,(uchar *)0x0,noncedata,0);
  bVar24 = iVar16 != 0;
  if (bVar24) {
    uVar22 = 1;
    do {
      local_254 = (uint)bVar24;
      secp256k1_scalar_set_b32(&local_158,local_d8,(int *)local_1e8);
      uVar23 = local_158.d[0];
      uVar10 = local_158.d[1];
      uVar11 = local_158.d[2];
      uVar12 = local_158.d[3];
      bVar24 = ((local_158.d[2] != 0 || local_158.d[3] != 0) ||
               (local_158.d[1] != 0 || local_158.d[0] != 0)) && local_1e8._0_4_ == 0;
      local_250 = (uint)bVar24;
      if (local_238->declassify != 0) {
        local_1e8._8_8_ = &local_250;
        local_1e8._0_8_ = 0x4d430002;
        local_1d8 = ZEXT816(4);
        local_1c8 = ZEXT816(0);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_138._8_8_;
        local_138 = auVar2 << 0x40;
      }
      if (bVar24) {
        local_24c = 0;
        local_22c = uVar22;
        secp256k1_ecmult_gen(&local_238->ecmult_gen_ctx,(secp256k1_gej *)local_1e8,&local_158);
        secp256k1_ge_set_gej((secp256k1_ge *)local_138,(secp256k1_gej *)local_1e8);
        secp256k1_fe_impl_normalize((secp256k1_fe *)local_138);
        secp256k1_fe_impl_normalize((secp256k1_fe *)(local_118 + 8));
        secp256k1_fe_impl_get_b32(local_58,(secp256k1_fe *)local_138);
        secp256k1_scalar_set_b32(local_248,local_58,&local_24c);
        if (local_240 != (uint *)0x0) {
          *local_240 = (local_118._8_4_ & 1) + local_24c * 2;
        }
        secp256k1_scalar_mul((secp256k1_scalar *)local_78,local_248,&local_98);
        secp256k1_scalar_add((secp256k1_scalar *)local_78,(secp256k1_scalar *)local_78,&local_b8);
        local_210.v[0] = uVar23 & 0x3fffffffffffffff;
        local_210.v[1] = (uVar10 & 0xfffffffffffffff) << 2 | uVar23 >> 0x3e;
        local_210.v[2] = (uVar11 & 0x3ffffffffffffff) << 4 | uVar10 >> 0x3c;
        local_210.v[3] = (uVar12 & 0xffffffffffffff) << 6 | uVar11 >> 0x3a;
        local_210.v[4] = uVar12 >> 0x38;
        secp256k1_modinv64(&local_210,&secp256k1_const_modinfo_scalar);
        psVar13 = local_228;
        local_228->d[0] = local_210.v[1] << 0x3e | local_210.v[0];
        local_228->d[1] = local_210.v[2] << 0x3c | (ulong)local_210.v[1] >> 2;
        local_228->d[2] = local_210.v[3] << 0x3a | (ulong)local_210.v[2] >> 4;
        local_228->d[3] = local_210.v[4] << 0x38 | (ulong)local_210.v[3] >> 6;
        secp256k1_scalar_mul(local_228,local_228,(secp256k1_scalar *)local_78);
        local_68 = (undefined1  [16])0x0;
        local_78 = (undefined1  [16])0x0;
        local_178 = (undefined1  [16])0x0;
        local_188 = (undefined1  [16])0x0;
        local_198 = (undefined1  [16])0x0;
        local_1a8 = (undefined1  [16])0x0;
        local_1b8 = (undefined1  [16])0x0;
        local_1c8 = (undefined1  [16])0x0;
        local_1d8 = (undefined1  [16])0x0;
        local_1e8 = (undefined1  [16])0x0;
        uVar23 = 0;
        local_e8._0_4_ = 0;
        local_e8._4_4_ = 0;
        local_f8 = (undefined1  [16])0x0;
        local_108 = (undefined1  [16])0x0;
        local_118 = (undefined1  [16])0x0;
        local_128 = (undefined1  [16])0x0;
        local_138 = (undefined1  [16])0x0;
        uVar1 = psVar13->d[3];
        uVar3 = psVar13->d[2];
        uVar21 = (uint)(uVar1 >> 0x3f);
        uVar22 = uVar21 ^ 1;
        uVar15 = uVar22;
        if (uVar3 == 0xffffffffffffffff) {
          uVar15 = 0;
        }
        uVar4 = psVar13->d[1];
        if (0x5d576e7357a4501c < uVar4) {
          uVar22 = 0;
        }
        uVar5 = psVar13->d[0];
        uVar22 = (uVar22 | uVar15 | uVar1 < 0x7fffffffffffffff) ^ 1;
        uVar15 = 0;
        if (0xdfe92f46681b20a0 < uVar5) {
          uVar15 = uVar22;
        }
        if (0x5d576e7357a4501d < uVar4) {
          uVar15 = uVar22;
        }
        uVar15 = uVar15 | uVar21;
        local_210.v[0] = CONCAT44(local_210.v[0]._4_4_,uVar15);
        uVar18 = -(long)(int)uVar15;
        uVar6 = (ulong)CARRY8(uVar18 & 0xbfd25e8cd0364142,uVar5 ^ uVar18);
        uVar8 = (uVar18 & 0xbaaedce6af48a03b) + (uVar4 ^ uVar18);
        uVar7 = (ulong)(CARRY8(uVar18 & 0xbaaedce6af48a03b,uVar4 ^ uVar18) || CARRY8(uVar8,uVar6));
        uVar9 = (uVar18 & 0xfffffffffffffffe) + (uVar3 ^ uVar18);
        uVar17 = ((uVar1 ^ uVar18) - (long)(int)uVar15) +
                 (ulong)(CARRY8(uVar18 & 0xfffffffffffffffe,uVar3 ^ uVar18) || CARRY8(uVar9,uVar7));
        uVar10 = uVar8 + uVar6;
        uVar11 = (uVar18 & 0xbfd25e8cd0364142) + (uVar5 ^ uVar18);
        uVar12 = uVar9 + uVar7;
        if (((uVar3 == 0 && uVar1 == 0) && uVar4 == 0) && uVar5 == 0) {
          uVar17 = uVar23;
          uVar10 = uVar23;
          uVar11 = uVar23;
          uVar12 = uVar23;
        }
        psVar13->d[0] = uVar11;
        psVar13->d[1] = uVar10;
        psVar13->d[2] = uVar12;
        psVar13->d[3] = uVar17;
        if (local_240 != (uint *)0x0) {
          *local_240 = *local_240 ^ uVar15;
        }
        bVar24 = (((uVar10 != 0 || uVar11 != 0) || uVar12 != 0) || uVar17 != 0) &&
                 ((local_248->d[3] != 0 || local_248->d[1] != 0) ||
                 (local_248->d[2] != 0 || local_248->d[0] != 0));
        local_254 = (uint)bVar24;
        if (local_238->declassify != 0) {
          local_1e8._8_8_ = &local_254;
          local_1e8._0_8_ = 0x4d430002;
          local_1d8 = ZEXT816(4);
          local_1c8 = ZEXT816(0);
          local_138 = ZEXT816(0) << 0x40;
        }
        uVar15 = (uint)bVar24;
        uVar22 = local_22c;
        if (uVar15 != 0) break;
      }
      uVar15 = 0;
      iVar16 = (*local_160)(local_d8,local_220,local_218,(uchar *)0x0,noncedata,uVar22);
      uVar22 = uVar22 + 1;
      bVar24 = iVar16 != 0;
    } while (bVar24);
  }
  uVar22 = (uint)((uVar15 & local_230) == 0);
  lVar19 = (long)(int)uVar22 + -1;
  auVar25._8_4_ = (int)lVar19;
  auVar25._0_8_ = lVar19;
  auVar25._12_4_ = (int)((ulong)lVar19 >> 0x20);
  auVar2 = *(undefined1 (*) [16])(local_248->d + 2);
  *(undefined1 (*) [16])local_248->d = *(undefined1 (*) [16])local_248->d & auVar25;
  *(undefined1 (*) [16])(local_248->d + 2) = auVar2 & auVar25;
  lVar19 = (long)(int)uVar22 + -1;
  auVar26._8_4_ = (int)lVar19;
  auVar26._0_8_ = lVar19;
  auVar26._12_4_ = (int)((ulong)lVar19 >> 0x20);
  auVar2 = *(undefined1 (*) [16])(local_228->d + 2);
  *(undefined1 (*) [16])local_228->d = *(undefined1 (*) [16])local_228->d & auVar26;
  *(undefined1 (*) [16])(local_228->d + 2) = auVar2 & auVar26;
  if (local_240 != (uint *)0x0) {
    *local_240 = *local_240 & uVar22 - 1;
  }
  return uVar15 & local_230;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}